

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NtkSopTranspose(char *pSop,int nVars,Vec_Ptr_t *vCubes,Vec_Str_t *vStore)

{
  int iVar1;
  void *pvVar2;
  char *Entry;
  int local_3c;
  int local_38;
  int c;
  int v;
  int nCubes;
  char *pCube;
  Vec_Str_t *vStore_local;
  Vec_Ptr_t *vCubes_local;
  int nVars_local;
  char *pSop_local;
  
  Vec_PtrClear(vCubes);
  for (_v = pSop; *_v != '\0'; _v = _v + (nVars + 3)) {
    Vec_PtrPush(vCubes,_v);
  }
  Vec_StrClear(vStore);
  for (local_38 = 0; local_38 < nVars; local_38 = local_38 + 1) {
    for (local_3c = 0; iVar1 = Vec_PtrSize(vCubes), local_3c < iVar1; local_3c = local_3c + 1) {
      pvVar2 = Vec_PtrEntry(vCubes,local_3c);
      Vec_StrPush(vStore,*(char *)((long)pvVar2 + (long)local_38));
    }
    Vec_StrPush(vStore,'\0');
  }
  iVar1 = Vec_PtrSize(vCubes);
  Vec_PtrClear(vCubes);
  for (local_38 = 0; local_38 < nVars; local_38 = local_38 + 1) {
    Entry = Vec_StrEntryP(vStore,local_38 * (iVar1 + 1));
    Vec_PtrPush(vCubes,Entry);
  }
  return;
}

Assistant:

void Abc_NtkSopTranspose( char * pSop, int nVars, Vec_Ptr_t * vCubes, Vec_Str_t * vStore )
{
    char * pCube; 
    int nCubes, v, c;
    // collect original cubes
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // rebuild the cubes
    Vec_StrClear( vStore );
    for ( v = 0; v < nVars; v++ )
    {
        Vec_PtrForEachEntry( char *, vCubes, pCube, c )
            Vec_StrPush( vStore, pCube[v] );
        Vec_StrPush( vStore, '\0' );
    }
    // get the cubes
    nCubes = Vec_PtrSize( vCubes );
    Vec_PtrClear( vCubes );
    for ( v = 0; v < nVars; v++ )
        Vec_PtrPush( vCubes, Vec_StrEntryP(vStore, v*(nCubes+1)) );
}